

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall r_comp::Decompiler::write_pgm(Decompiler *this,uint16_t read_index)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (this->closing_set == true) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  uStack_18 = CONCAT17(0x28,(undefined7)uStack_18);
  OutStream::push<char>(this->out_stream,(char *)((long)&uStack_18 + 7),read_index);
  write_expression_head(this,read_index);
  write_expression_tail(this,read_index,true,false);
  if (this->closing_set == true) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  uStack_18._0_7_ = CONCAT16(0x29,(undefined6)uStack_18);
  OutStream::operator<<(this->out_stream,(char *)((long)&uStack_18 + 6));
  return;
}

Assistant:

void Decompiler::write_pgm(uint16_t read_index)
{
    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    out_stream->push('(', read_index);
    write_expression_head(read_index);
    write_expression_tail(read_index, true);

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    *out_stream << ')';
}